

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

uint32_t arm_phys_excp_target_el_arm(CPUState *cs,uint32_t excp_idx,uint32_t cur_el,_Bool secure)

{
  CPUARMState *env_00;
  int iVar1;
  int iVar2;
  uint32_t uVar3;
  uint64_t uVar4;
  bool bVar5;
  uint64_t hcr_el2;
  bool local_2a;
  _Bool is64;
  int target_el;
  _Bool hcr;
  _Bool scr;
  _Bool rw;
  CPUARMState *env;
  _Bool secure_local;
  uint32_t cur_el_local;
  uint32_t excp_idx_local;
  CPUState *cs_local;
  
  env_00 = (CPUARMState *)cs->env_ptr;
  iVar1 = arm_feature(env_00,0x1c);
  iVar2 = arm_feature(env_00,0x21);
  is64 = iVar1 != 0;
  if (iVar2 != 0) {
    is64 = ((env_00->cp15).scr_el3 & 0x400) == 0x400;
  }
  uVar4 = arm_hcr_el2_eff_arm(env_00);
  if (excp_idx == 5) {
    local_2a = ((env_00->cp15).scr_el3 & 2) == 2;
    bVar5 = (uVar4 & 0x10) != 0;
  }
  else if (excp_idx == 6) {
    local_2a = ((env_00->cp15).scr_el3 & 4) == 4;
    bVar5 = (uVar4 & 8) != 0;
  }
  else {
    local_2a = ((env_00->cp15).scr_el3 & 8) == 8;
    bVar5 = (uVar4 & 0x20) != 0;
  }
  uVar3 = (uint32_t)
          target_el_table[iVar1 != 0][local_2a][is64][bVar5 || (uVar4 & 0x8000000) != 0][secure]
          [cur_el];
  if ((int)uVar3 < 1) {
    __assert_fail("target_el > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/helper.c"
                  ,0x2008,
                  "uint32_t arm_phys_excp_target_el_arm(CPUState *, uint32_t, uint32_t, _Bool)");
  }
  return uVar3;
}

Assistant:

uint32_t arm_phys_excp_target_el(CPUState *cs, uint32_t excp_idx,
                                 uint32_t cur_el, bool secure)
{
    CPUARMState *env = cs->env_ptr;
    bool rw;
    bool scr;
    bool hcr;
    int target_el;
    /* Is the highest EL AArch64? */
    bool is64 = arm_feature(env, ARM_FEATURE_AARCH64);
    uint64_t hcr_el2;

    if (arm_feature(env, ARM_FEATURE_EL3)) {
        rw = ((env->cp15.scr_el3 & SCR_RW) == SCR_RW);
    } else {
        /* Either EL2 is the highest EL (and so the EL2 register width
         * is given by is64); or there is no EL2 or EL3, in which case
         * the value of 'rw' does not affect the table lookup anyway.
         */
        rw = is64;
    }

    hcr_el2 = arm_hcr_el2_eff(env);
    switch (excp_idx) {
    case EXCP_IRQ:
        scr = ((env->cp15.scr_el3 & SCR_IRQ) == SCR_IRQ);
        hcr = hcr_el2 & HCR_IMO;
        break;
    case EXCP_FIQ:
        scr = ((env->cp15.scr_el3 & SCR_FIQ) == SCR_FIQ);
        hcr = hcr_el2 & HCR_FMO;
        break;
    default:
        scr = ((env->cp15.scr_el3 & SCR_EA) == SCR_EA);
        hcr = hcr_el2 & HCR_AMO;
        break;
    };

    /*
     * For these purposes, TGE and AMO/IMO/FMO both force the
     * interrupt to EL2.  Fold TGE into the bit extracted above.
     */
    hcr |= (hcr_el2 & HCR_TGE) != 0;

    /* Perform a table-lookup for the target EL given the current state */
    target_el = target_el_table[is64][scr][rw][hcr][secure][cur_el];

    assert(target_el > 0);

    return target_el;
}